

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

string * (anonymous_namespace)::lexical_cast<std::__cxx11::string,int>(int arg)

{
  byte bVar1;
  long *plVar2;
  istream *piVar3;
  string *this;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int in_ESI;
  string *in_RDI;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  stringstream interpreter;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8 [2];
  string local_1b8 [32];
  stringstream local_198 [16];
  undefined1 local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::__cxx11::string::string(local_1b8);
  plVar2 = (long *)std::ostream::operator<<(local_188,local_c);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((bVar1 & 1) == 0) {
    piVar3 = std::operator>>((istream *)local_198,local_1b8);
    bVar1 = std::ios::operator!((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::istream::operator>>(local_198,std::ws<char,std::char_traits<char>>);
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) != 0) {
        std::__cxx11::string::string(in_RDI,local_1b8);
        goto LAB_001247c9;
      }
    }
  }
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this);
  MeCab::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  scoped_ptr(local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  this_00 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)MeCab::
               scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_1d8);
  std::__cxx11::string::string(in_RDI,(string *)this_00);
  MeCab::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
LAB_001247c9:
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

Target lexical_cast(Source arg) {
  std::stringstream interpreter;
  Target result;
  if (!(interpreter << arg) || !(interpreter >> result) ||
      !(interpreter >> std::ws).eof()) {
    MeCab::scoped_ptr<Target> r(new Target());  // return default value
    return *r;
  }
  return result;
}